

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall crsGA::Logger::Logger(Logger *this)

{
  allocator<char> local_a9;
  string local_a8;
  shared_ptr<DefaultFileLogHandler> local_88;
  shared_ptr<crsGA::LogHandler> local_78;
  allocator<char> local_61;
  string local_60;
  shared_ptr<StandardOutputLogHandler> local_40;
  shared_ptr<crsGA::LogHandler> local_30 [2];
  Logger *local_10;
  Logger *this_local;
  
  this->_vptr_Logger = (_func_int **)&PTR__Logger_00133ba0;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->_logHandlersMap)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  local_10 = this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>_>_>_>
  ::map(&this->_logHandlersMap);
  this->_currentLogLevel = LOG_NOTICE;
  std::atomic<bool>::atomic(&this->_exit,false);
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::mutex::mutex(&this->_mutex);
  ThreadSafeQueue<crsGA::Logger::LogMessage>::ThreadSafeQueue(&this->_queue);
  (this->_thread)._M_id._M_thread = 0;
  std::thread::thread(&this->_thread);
  std::make_shared<StandardOutputLogHandler>();
  std::shared_ptr<crsGA::LogHandler>::shared_ptr<StandardOutputLogHandler,void>(local_30,&local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"StandardOutputLogHandler",&local_61);
  addLogHandler(this,local_30,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::shared_ptr<crsGA::LogHandler>::~shared_ptr(local_30);
  std::shared_ptr<StandardOutputLogHandler>::~shared_ptr(&local_40);
  std::make_shared<DefaultFileLogHandler>();
  std::shared_ptr<crsGA::LogHandler>::shared_ptr<DefaultFileLogHandler,void>(&local_78,&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"DefaultFileLogHandler",&local_a9);
  addLogHandler(this,&local_78,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::shared_ptr<crsGA::LogHandler>::~shared_ptr(&local_78);
  std::shared_ptr<DefaultFileLogHandler>::~shared_ptr(&local_88);
  return;
}

Assistant:

Logger::Logger()
    : _logHandlersMap()
    , _currentLogLevel(LOG_NOTICE)
    , _exit(false)
    , _mutex()
    , _queue()
    , _thread()
{
    addLogHandler(std::make_shared<StandardOutputLogHandler>(), std::string("StandardOutputLogHandler"));
    addLogHandler(std::make_shared<DefaultFileLogHandler>(), std::string("DefaultFileLogHandler"));
}